

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcases.c
# Opt level: O1

int test_json2map_objectHook(void)

{
  int iVar1;
  char *__s2;
  json2map_t *obj;
  map2json_t *obj_00;
  char *pcVar2;
  int iVar3;
  long lVar4;
  
  __s2 = (char *)calloc(0x1fe,0xff);
  iVar3 = 1;
  obj = json2map_init('\x01');
  json2map_registerDataHook(obj,__s2,json2map_hookMethod);
  json2map_parse(obj,(char *)0x0,
                 "{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}}}"
                );
  printf("Expected: \t%s\nActual: \t%s\n\n","lvl1[o]",__s2);
  iVar1 = strcmp("lvl1[o]",__s2);
  if (iVar1 == 0) {
    pcVar2 = __s2 + 0xff;
    printf("Expected: \t%s\nActual: \t%s\n\n",
           "{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}}"
           ,pcVar2);
    iVar1 = strcmp("{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}}"
                   ,pcVar2);
    if (iVar1 == 0) {
      printf("Expected: \t%s\nActual: \t%s\n\n","lvl1.lvl2[o]",__s2 + 0x1fe);
      iVar1 = strcmp("lvl1.lvl2[o]",__s2 + 0x1fe);
      if (iVar1 == 0) {
        printf("Expected: \t%s\nActual: \t%s\n\n",
               "{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}"
               ,__s2 + 0x2fd);
        iVar1 = strcmp("{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}"
                       ,__s2 + 0x2fd);
        if (iVar1 == 0) {
          printf("Expected: \t%s\nActual: \t%s\n\n","lvl1.lvl2.lvl3[o]",__s2 + 0x3fc);
          iVar1 = strcmp("lvl1.lvl2.lvl3[o]",__s2 + 0x3fc);
          if (iVar1 == 0) {
            printf("Expected: \t%s\nActual: \t%s\n\n",
                   "{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}"
                   ,__s2 + 0x4fb);
            iVar1 = strcmp("{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}"
                           ,__s2 + 0x4fb);
            if (iVar1 == 0) {
              printf("Expected: \t%s\nActual: \t%s\n\n","lvl1.lvl2.lvl3.lvl4[o]",__s2 + 0x5fa);
              iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4[o]",__s2 + 0x5fa);
              if (iVar1 == 0) {
                printf("Expected: \t%s\nActual: \t%s\n\n",
                       "{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}"
                       ,__s2 + 0x6f9);
                iVar1 = strcmp("{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}"
                               ,__s2 + 0x6f9);
                if (iVar1 == 0) {
                  printf("Expected: \t%s\nActual: \t%s\n\n","lvl1.lvl2.lvl3.lvl4.lvl5[0][o]",
                         __s2 + 0x7f8);
                  iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[0][o]",__s2 + 0x7f8);
                  if (iVar1 == 0) {
                    printf("Expected: \t%s\nActual: \t%s\n\n",
                           "{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}"
                           ,__s2 + 0x8f7);
                    iVar1 = strcmp("{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}"
                                   ,__s2 + 0x8f7);
                    if (iVar1 == 0) {
                      printf("Expected: \t%s\nActual: \t%s\n\n",
                             "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6[o]",__s2 + 0x9f6);
                      iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6[o]",__s2 + 0x9f6);
                      if (iVar1 == 0) {
                        printf("Expected: \t%s\nActual: \t%s\n\n",
                               "{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}",
                               __s2 + 0xaf5);
                        iVar1 = strcmp("{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}"
                                       ,__s2 + 0xaf5);
                        if (iVar1 == 0) {
                          printf("Expected: \t%s\nActual: \t%s\n\n",
                                 "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7[o]",__s2 + 0xbf4);
                          iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7[o]",__s2 + 0xbf4);
                          if (iVar1 == 0) {
                            printf("Expected: \t%s\nActual: \t%s\n\n",
                                   "{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}",
                                   __s2 + 0xcf3);
                            iVar1 = strcmp("{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}",
                                           __s2 + 0xcf3);
                            if (iVar1 == 0) {
                              printf("Expected: \t%s\nActual: \t%s\n\n",
                                     "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0][o]",__s2 + 0xdf2
                                    );
                              iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0][o]",
                                             __s2 + 0xdf2);
                              if (iVar1 == 0) {
                                printf("Expected: \t%s\nActual: \t%s\n\n","{\"lvl9\":123456789}",
                                       __s2 + 0xef1);
                                iVar1 = strcmp("{\"lvl9\":123456789}",__s2 + 0xef1);
                                if (iVar1 == 0) {
                                  printf("Expected: \t%s\nActual: \t%s\n\n",
                                         "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0].lvl9",
                                         __s2 + 0xff0);
                                  iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0].lvl9"
                                                 ,__s2 + 0xff0);
                                  if (iVar1 == 0) {
                                    printf("Expected: \t%s\nActual: \t%s\n\n","123456789",
                                           __s2 + 0x10ef);
                                    iVar1 = strcmp("123456789",__s2 + 0x10ef);
                                    if (iVar1 == 0) {
                                      printf("Expected: \t%s\nActual: \t%s\n\n",
                                             "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[1][o]",
                                             __s2 + 0x11ee);
                                      iVar1 = strcmp(
                                                  "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[1][o]"
                                                  ,__s2 + 0x11ee);
                                      if (iVar1 == 0) {
                                        printf("Expected: \t%s\nActual: \t%s\n\n",
                                               "{\"key\":\"value\"}",__s2 + 0x12ed);
                                        iVar1 = strcmp("{\"key\":\"value\"}",__s2 + 0x12ed);
                                        if (iVar1 == 0) {
                                          printf("Expected: \t%s\nActual: \t%s\n\n",
                                                 "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[1].key"
                                                 ,__s2 + 0x13ec);
                                          iVar1 = strcmp(
                                                  "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[1].key"
                                                  ,__s2 + 0x13ec);
                                          if (iVar1 == 0) {
                                            printf("Expected: \t%s\nActual: \t%s\n\n","value",
                                                   __s2 + 0x14eb);
                                            iVar1 = strcmp("value",__s2 + 0x14eb);
                                            if (iVar1 == 0) {
                                              printf("Expected: \t%s\nActual: \t%s\n\n",
                                                     "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[x]"
                                                     ,__s2 + 0x15ea);
                                              iVar1 = strcmp(
                                                  "lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[x]",
                                                  __s2 + 0x15ea);
                                              if (iVar1 == 0) {
                                                printf("Expected: \t%s\nActual: \t%s\n\n","2",
                                                       __s2 + 0x16e9);
                                                iVar1 = strcmp("2",__s2 + 0x16e9);
                                                if (iVar1 == 0) {
                                                  printf("Expected: \t%s\nActual: \t%s\n\n",
                                                         "lvl1.lvl2.lvl3.lvl4.lvl5[1]",__s2 + 0x17e8
                                                        );
                                                  iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[1]",
                                                                 __s2 + 0x17e8);
                                                  if (iVar1 == 0) {
                                                    printf("Expected: \t%s\nActual: \t%s\n\n","abc",
                                                           __s2 + 0x18e7);
                                                    iVar1 = strcmp("abc",__s2 + 0x18e7);
                                                    if (iVar1 == 0) {
                                                      printf("Expected: \t%s\nActual: \t%s\n\n",
                                                             "lvl1.lvl2.lvl3.lvl4.lvl5[x]",
                                                             __s2 + 0x19e6);
                                                      iVar1 = strcmp("lvl1.lvl2.lvl3.lvl4.lvl5[x]",
                                                                     __s2 + 0x19e6);
                                                      if (iVar1 == 0) {
                                                        printf("Expected: \t%s\nActual: \t%s\n\n",
                                                               "2",__s2 + 0x1ae5);
                                                        iVar1 = strcmp("2",__s2 + 0x1ae5);
                                                        if (iVar1 == 0) {
                                                          lVar4 = 0;
                                                          obj_00 = map2json_init((char *)0x0);
                                                          do {
                                                            map2json_push(obj_00,__s2 + lVar4,
                                                                          pcVar2 + lVar4);
                                                            lVar4 = lVar4 + 0x1fe;
                                                          } while (lVar4 != 0x1be4);
                                                          pcVar2 = map2json_create(obj_00);
                                                          printf("Expected: \t%s\nActual: \t%s\n\n",
                                                                                                                                  
                                                  "{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[\"{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}\",\"abc\"]}}}}}"
                                                  ,pcVar2);
                                                  pcVar2 = map2json_create(obj_00);
                                                  iVar1 = strcmp(
                                                  "{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[\"{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}\",\"abc\"]}}}}}"
                                                  ,pcVar2);
                                                  if (iVar1 == 0) {
                                                    json2map_destroy(obj);
                                                    free(__s2);
                                                    iVar3 = 0;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int test_json2map_objectHook() {
	keyvalue_t *map = (keyvalue_t *) calloc(sizeof(keyvalue_t), LIST_SIZE);
	int i;

	json2map_t *json2mapObj = json2map_init(1);
	json2map_registerDataHook(json2mapObj, map, &json2map_hookMethod);
	json2map_parse(json2mapObj, NULL, "{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}}}");

	ASSERTSTR("lvl1[o]", map[0].key);
	ASSERTSTR("{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}}", map[0].value);

	ASSERTSTR("lvl1.lvl2[o]", map[1].key);
	ASSERTSTR("{\"lvl3\":{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}}", map[1].value);

	ASSERTSTR("lvl1.lvl2.lvl3[o]", map[2].key);
	ASSERTSTR("{\"lvl4\":{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}}", map[2].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4[o]", map[3].key);
	ASSERTSTR("{\"lvl5\":[{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}, \"abc\"]}", map[3].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0][o]", map[4].key);
	ASSERTSTR("{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}", map[4].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6[o]", map[5].key);
	ASSERTSTR("{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}", map[5].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7[o]", map[6].key);
	ASSERTSTR("{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}", map[6].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0][o]", map[7].key);
	ASSERTSTR("{\"lvl9\":123456789}", map[7].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[0].lvl9", map[8].key);
	ASSERTSTR("123456789", map[8].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[1][o]", map[9].key);
	ASSERTSTR("{\"key\":\"value\"}", map[9].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[1].key", map[10].key);
	ASSERTSTR("value", map[10].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[0].lvl6.lvl7.lvl8[x]", map[11].key);
	ASSERTSTR("2", map[11].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[1]", map[12].key);
	ASSERTSTR("abc", map[12].value);

	ASSERTSTR("lvl1.lvl2.lvl3.lvl4.lvl5[x]", map[13].key);
	ASSERTSTR("2", map[13].value);

	map2json_t *tree = map2json_init(NULL);
	for ( i = 0; i < 14; i++ ) {
		map2json_push(tree, map[i].key, map[i].value);
	}
	ASSERTSTR("{\"lvl1\":{\"lvl2\":{\"lvl3\":{\"lvl4\":{\"lvl5\":[\"{\"lvl6\":{\"lvl7\":{\"lvl8\":[{\"lvl9\":123456789}, {\"key\":\"value\"}]}}}\",\"abc\"]}}}}}", map2json_create(tree));
	json2map_destroy(json2mapObj);
	free(map);
	return 0;
}